

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void __thiscall
optTyped_moveAssignmentEmptyForEmpty_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>::TestBody
          (optTyped_moveAssignmentEmptyForEmpty_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>
           *this)

{
  bool bVar1;
  storage_type sVar2;
  char *message;
  AssertionResult gtest_ar_;
  storage_type local_31;
  AssertHelper local_30;
  Message local_28;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  AssertHelper local_18;
  
  local_31.null_value = 0xff;
  local_28.ss_.ptr_._0_1_ = (internal)0x1;
  local_20.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ss_.ptr_._0_1_ = (internal)0x1;
  local_20.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    mp::opt<bool,_mp::opt_default_policy<bool>_>::value
              ((opt<bool,_mp::opt_default_policy<bool>_> *)&local_31);
  }
  testing::Message::Message(&local_28);
  testing::internal::AssertHelper::AssertHelper
            (&local_30,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
             0x25c,
             "Expected: o2.value() throws an exception of type bad_optional_access.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_30,&local_28);
  testing::internal::AssertHelper::~AssertHelper(&local_30);
  if (CONCAT71(local_28.ss_.ptr_._1_7_,local_28.ss_.ptr_._0_1_) != 0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((long *)CONCAT71(local_28.ss_.ptr_._1_7_,local_28.ss_.ptr_._0_1_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_28.ss_.ptr_._1_7_,local_28.ss_.ptr_._0_1_) + 8))();
    }
  }
  sVar2 = (storage_type)
          (this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).value_2;
  if (local_31.value != true) {
    sVar2 = local_31;
  }
  local_30.data_._0_1_ = sVar2.null_value & 1;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_28,"this->value_2","o2.value_or(this->value_2)",
             &(this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).value_2,
             (bool *)&local_30);
  if (local_28.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x25d,message);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if (CONCAT71(local_30.data_._1_7_,(byte)local_30.data_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_30.data_._1_7_,(byte)local_30.data_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_30.data_._1_7_,(byte)local_30.data_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TYPED_TEST(optTyped, moveAssignmentEmptyForEmpty)
{
  using opt_type = typename TestFixture::type;
  opt_type o1;
  opt_type o2;
  o2 = std::move(o1);
  EXPECT_FALSE(o2);
  EXPECT_FALSE(o2.has_value());
  EXPECT_THROW(o2.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, o2.value_or(this->value_2));
}